

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::InitMaterial(material_t *material)

{
  int local_14;
  int i;
  material_t *material_local;
  
  InitTexOpt(&material->ambient_texopt,false);
  InitTexOpt(&material->diffuse_texopt,false);
  InitTexOpt(&material->specular_texopt,false);
  InitTexOpt(&material->specular_highlight_texopt,false);
  InitTexOpt(&material->bump_texopt,true);
  InitTexOpt(&material->displacement_texopt,false);
  InitTexOpt(&material->alpha_texopt,false);
  InitTexOpt(&material->reflection_texopt,false);
  InitTexOpt(&material->roughness_texopt,false);
  InitTexOpt(&material->metallic_texopt,false);
  InitTexOpt(&material->sheen_texopt,false);
  InitTexOpt(&material->emissive_texopt,false);
  InitTexOpt(&material->normal_texopt,false);
  std::__cxx11::string::operator=((string *)material,"");
  std::__cxx11::string::operator=((string *)&material->ambient_texname,"");
  std::__cxx11::string::operator=((string *)&material->diffuse_texname,"");
  std::__cxx11::string::operator=((string *)&material->specular_texname,"");
  std::__cxx11::string::operator=((string *)&material->specular_highlight_texname,"");
  std::__cxx11::string::operator=((string *)&material->bump_texname,"");
  std::__cxx11::string::operator=((string *)&material->displacement_texname,"");
  std::__cxx11::string::operator=((string *)&material->reflection_texname,"");
  std::__cxx11::string::operator=((string *)&material->alpha_texname,"");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    material->ambient[local_14] = 0.0;
    material->diffuse[local_14] = 0.0;
    material->specular[local_14] = 0.0;
    material->transmittance[local_14] = 0.0;
    material->emission[local_14] = 0.0;
  }
  material->illum = 0;
  material->dissolve = 1.0;
  material->shininess = 1.0;
  material->ior = 1.0;
  material->roughness = 0.0;
  material->metallic = 0.0;
  material->sheen = 0.0;
  material->clearcoat_thickness = 0.0;
  material->clearcoat_roughness = 0.0;
  material->anisotropy_rotation = 0.0;
  material->anisotropy = 0.0;
  std::__cxx11::string::operator=((string *)&material->roughness_texname,"");
  std::__cxx11::string::operator=((string *)&material->metallic_texname,"");
  std::__cxx11::string::operator=((string *)&material->sheen_texname,"");
  std::__cxx11::string::operator=((string *)&material->emissive_texname,"");
  std::__cxx11::string::operator=((string *)&material->normal_texname,"");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&material->unknown_parameter);
  return;
}

Assistant:

static void InitMaterial(material_t *material) {
  InitTexOpt(&material->ambient_texopt, /* is_bump */ false);
  InitTexOpt(&material->diffuse_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_highlight_texopt, /* is_bump */ false);
  InitTexOpt(&material->bump_texopt, /* is_bump */ true);
  InitTexOpt(&material->displacement_texopt, /* is_bump */ false);
  InitTexOpt(&material->alpha_texopt, /* is_bump */ false);
  InitTexOpt(&material->reflection_texopt, /* is_bump */ false);
  InitTexOpt(&material->roughness_texopt, /* is_bump */ false);
  InitTexOpt(&material->metallic_texopt, /* is_bump */ false);
  InitTexOpt(&material->sheen_texopt, /* is_bump */ false);
  InitTexOpt(&material->emissive_texopt, /* is_bump */ false);
  InitTexOpt(&material->normal_texopt,
             /* is_bump */ false);  // @fixme { is_bump will be true? }
  material->name = "";
  material->ambient_texname = "";
  material->diffuse_texname = "";
  material->specular_texname = "";
  material->specular_highlight_texname = "";
  material->bump_texname = "";
  material->displacement_texname = "";
  material->reflection_texname = "";
  material->alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material->ambient[i] = static_cast<real_t>(0.0);
    material->diffuse[i] = static_cast<real_t>(0.0);
    material->specular[i] = static_cast<real_t>(0.0);
    material->transmittance[i] = static_cast<real_t>(0.0);
    material->emission[i] = static_cast<real_t>(0.0);
  }
  material->illum = 0;
  material->dissolve = static_cast<real_t>(1.0);
  material->shininess = static_cast<real_t>(1.0);
  material->ior = static_cast<real_t>(1.0);

  material->roughness = static_cast<real_t>(0.0);
  material->metallic = static_cast<real_t>(0.0);
  material->sheen = static_cast<real_t>(0.0);
  material->clearcoat_thickness = static_cast<real_t>(0.0);
  material->clearcoat_roughness = static_cast<real_t>(0.0);
  material->anisotropy_rotation = static_cast<real_t>(0.0);
  material->anisotropy = static_cast<real_t>(0.0);
  material->roughness_texname = "";
  material->metallic_texname = "";
  material->sheen_texname = "";
  material->emissive_texname = "";
  material->normal_texname = "";

  material->unknown_parameter.clear();
}